

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::kernelType(void)

{
  long lVar1;
  int iVar2;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  utsname u;
  QString *in_stack_fffffffffffffe08;
  char (*in_stack_fffffffffffffe18) [65];
  QByteArrayView *this;
  undefined1 local_18e [62];
  QByteArrayView in_stack_fffffffffffffeb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  memset(local_18e,0xaa,0x186);
  iVar2 = uname((utsname *)local_18e);
  if (iVar2 == 0) {
    QByteArrayView::QByteArrayView<65ul>(this,in_stack_fffffffffffffe18);
    QString::fromLatin1(in_stack_fffffffffffffeb0);
    QString::toLower(in_stack_fffffffffffffe08);
    QString::~QString((QString *)0x25aa74);
  }
  else {
    unknownText();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::kernelType()
{
#if defined(Q_OS_WIN)
    return QStringLiteral("winnt");
#elif defined(Q_OS_UNIX)
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname).toLower();
#endif
    return unknownText();
}